

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backed_block.cpp
# Opt level: O0

int queue_bb(backed_block_list *bbl,backed_block *new_bb)

{
  long lVar1;
  int iVar2;
  backed_block *in_RSI;
  backed_block *in_RDI;
  bool bVar3;
  backed_block *bb;
  long local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  lVar1._0_4_ = in_RDI->block;
  lVar1._4_4_ = in_RDI->len;
  if (lVar1 == 0) {
    *(backed_block **)in_RDI = in_RSI;
  }
  else if (in_RSI->block < **(uint **)in_RDI) {
    in_RSI->next = *(backed_block **)in_RDI;
    *(backed_block **)in_RDI = in_RSI;
  }
  else {
    if ((*(long *)&in_RDI->type == 0) || (in_RSI->block <= **(uint **)&in_RDI->type)) {
      local_20._0_4_ = in_RDI->block;
      local_20._4_4_ = in_RDI->len;
    }
    else {
      local_20 = *(long *)&in_RDI->type;
    }
    *(backed_block **)&in_RDI->type = in_RSI;
    while( true ) {
      bVar3 = false;
      if (*(long *)(local_20 + 0x20) != 0) {
        bVar3 = **(uint **)(local_20 + 0x20) < in_RSI->block;
      }
      if (!bVar3) break;
      local_20 = *(long *)(local_20 + 0x20);
    }
    if (*(long *)(local_20 + 0x20) == 0) {
      *(backed_block **)(local_20 + 0x20) = in_RSI;
    }
    else {
      in_RSI->next = *(backed_block **)(local_20 + 0x20);
      *(backed_block **)(local_20 + 0x20) = in_RSI;
    }
    merge_bb((backed_block_list *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             in_RDI,in_RSI);
    iVar2 = merge_bb((backed_block_list *)
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI);
    if (iVar2 == 0) {
      *(long *)&in_RDI->type = local_20;
    }
  }
  return 0;
}

Assistant:

static int queue_bb(struct backed_block_list* bbl, struct backed_block* new_bb) {
  struct backed_block* bb;

  if (bbl->data_blocks == nullptr) {
    bbl->data_blocks = new_bb;
    return 0;
  }

  if (bbl->data_blocks->block > new_bb->block) {
    new_bb->next = bbl->data_blocks;
    bbl->data_blocks = new_bb;
    return 0;
  }

  /* Optimization: blocks are mostly queued in sequence, so save the
     pointer to the last bb that was added, and start searching from
     there if the next block number is higher */
  if (bbl->last_used && new_bb->block > bbl->last_used->block)
    bb = bbl->last_used;
  else
    bb = bbl->data_blocks;
  bbl->last_used = new_bb;

  for (; bb->next && bb->next->block < new_bb->block; bb = bb->next)
    ;

  if (bb->next == nullptr) {
    bb->next = new_bb;
  } else {
    new_bb->next = bb->next;
    bb->next = new_bb;
  }

  merge_bb(bbl, new_bb, new_bb->next);
  if (!merge_bb(bbl, bb, new_bb)) {
    /* new_bb destroyed, point to retained as last_used */
    bbl->last_used = bb;
  }

  return 0;
}